

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

Vec_Int_t * Spl_ManFromWecMapping(Gia_Man_t *p,Vec_Wec_t *vMap)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  Vec_Int_t *p_00;
  ulong uVar5;
  int i;
  int iVar6;
  int iVar7;
  char *__assertion;
  int Counter;
  int iVar8;
  int Counter_1;
  int iVar9;
  
  if (p->vMapping2 == (Vec_Wec_t *)0x0) {
    __assertion = "Gia_ManHasMapping2(p)";
    uVar1 = 0x52;
  }
  else {
    iVar7 = p->nObjs;
    iVar8 = 0;
    for (iVar6 = 0; iVar2 = vMap->nSize, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pVVar3 = Vec_WecEntry(vMap,iVar6);
      iVar8 = iVar8 + pVVar3->nSize;
    }
    iVar9 = 0;
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pVVar3 = Vec_WecEntry(vMap,iVar6);
      iVar9 = iVar9 + (uint)(0 < pVVar3->nSize);
      iVar2 = vMap->nSize;
    }
    pVVar3 = Vec_IntAlloc(iVar8 + iVar7 + iVar9 * 2);
    uVar1 = p->nObjs;
    Vec_IntGrow(pVVar3,uVar1);
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pVVar3->pArray[uVar4] = 0;
    }
    pVVar3->nSize = uVar1;
    for (iVar7 = 0; iVar7 < vMap->nSize; iVar7 = iVar7 + 1) {
      p_00 = Vec_WecEntry(vMap,iVar7);
      if (0 < p_00->nSize) {
        Vec_IntWriteEntry(pVVar3,iVar7,pVVar3->nSize);
        Vec_IntPush(pVVar3,p_00->nSize);
        for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
          iVar8 = Vec_IntEntry(p_00,iVar6);
          Vec_IntPush(pVVar3,iVar8);
        }
        Vec_IntPush(pVVar3,iVar7);
      }
    }
    if ((pVVar3->nSize < 0x10) || (pVVar3->nSize == pVVar3->nCap)) {
      return pVVar3;
    }
    __assertion = "Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)";
    uVar1 = 0x5e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaSplit.c"
                ,uVar1,"Vec_Int_t *Spl_ManFromWecMapping(Gia_Man_t *, Vec_Wec_t *)");
}

Assistant:

Vec_Int_t * Spl_ManFromWecMapping( Gia_Man_t * p, Vec_Wec_t * vMap )
{
    Vec_Int_t * vMapping, * vVec; int i, k, Obj;
    assert( Gia_ManHasMapping2(p) );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p) + Vec_WecSizeSize(vMap) + 2*Vec_WecSizeUsed(vMap) );
    Vec_IntFill( vMapping, Gia_ManObjNum(p), 0 );
    Vec_WecForEachLevel( vMap, vVec, i )
        if ( Vec_IntSize(vVec) > 0 )
        {
            Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
            Vec_IntPush( vMapping, Vec_IntSize(vVec) );
            Vec_IntForEachEntry( vVec, Obj, k )
                Vec_IntPush( vMapping, Obj );
            Vec_IntPush( vMapping, i );
        }
    assert( Vec_IntSize(vMapping) < 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    return vMapping;
}